

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall
QFormLayout::getItemPosition(QFormLayout *this,int index,int *rowPtr,ItemRole *rolePtr)

{
  int idx;
  QFormLayoutPrivate *pQVar1;
  QFormLayoutItem **ppQVar2;
  int *in_RCX;
  int *in_RDX;
  long in_FS_OFFSET;
  bool spanning;
  int storageIndex;
  QFormLayoutPrivate *d;
  int row;
  int col;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar3;
  QFormLayoutItem *item;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QFormLayout *)0x4b7ef3);
  local_c = -1;
  local_10 = -1;
  item = (QFormLayoutItem *)&pQVar1->m_matrix;
  QList<QFormLayoutItem_*>::value
            ((QList<QFormLayoutItem_*> *)
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  idx = storageIndexFromLayoutItem
                  ((ItemMatrix *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),item)
  ;
  if (idx != -1) {
    QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::storageIndexToPosition
              (idx,&local_10,&local_c);
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = local_10;
  }
  if ((in_RCX != (int *)0x0) && (local_10 != -1)) {
    bVar3 = 0;
    if (local_c == 1) {
      ppQVar2 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                          ((FixedColumnMatrix<QFormLayoutItem_*,_2> *)
                           (ulong)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                           in_stack_ffffffffffffffa8);
      bVar3 = (*ppQVar2)->fullRow;
    }
    if ((bVar3 & 1) == 0) {
      *in_RCX = local_c;
    }
    else {
      *in_RCX = 2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFormLayout::getItemPosition(int index, int *rowPtr, ItemRole *rolePtr) const
{
    Q_D(const QFormLayout);
    int col = -1;
    int row = -1;

    const int storageIndex = storageIndexFromLayoutItem(d->m_matrix, d->m_things.value(index));
    if (storageIndex != -1)
        QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);

    if (rowPtr)
        *rowPtr = row;
    if (rolePtr && row != -1) {
        const bool spanning = col == 1 && d->m_matrix(row, col)->fullRow;
        if (spanning) {
            *rolePtr = SpanningRole;
        } else {
            *rolePtr = ItemRole(col);
        }
    }
}